

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O2

string * __thiscall
google::protobuf::gtest_ArenaStringSingleArena_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,TestParamInfo<bool> *info)

{
  bool bVar1;
  tuple<testing::internal::ParamGenerator<bool>_> t;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  bVar1 = testing::internal::AlwaysFalse();
  if (bVar1) {
    testing::Bool();
    std::
    __shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_28,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  testing::internal::DefaultParamName<bool>(__return_storage_ptr__,(TestParamInfo<bool> *)this);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}